

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2cell.cc
# Opt level: O0

S1ChordAngle __thiscall S2Cell::GetDistance(S2Cell *this,S2Point *a,S2Point *b)

{
  bool bVar1;
  int iVar2;
  S1ChordAngle *pSVar3;
  long lVar4;
  S1ChordAngle y;
  S1ChordAngle SVar5;
  Vector3<double> *local_160;
  int local_150;
  int local_14c;
  int i_2;
  int i_1;
  S2EdgeCrosser crosser;
  VType local_d0;
  VType local_c8;
  int local_bc;
  undefined1 local_b8 [4];
  int i;
  S2Point v [4];
  S1ChordAngle local_40;
  S1ChordAngle local_38;
  S1ChordAngle local_30;
  S1ChordAngle min_dist;
  S2Point *b_local;
  S2Point *a_local;
  S2Cell *this_local;
  
  min_dist.length2_ = (double)b;
  local_38 = GetDistance(this,a);
  local_40 = GetDistance(this,min_dist.length2_);
  pSVar3 = std::min<S1ChordAngle>(&local_38,&local_40);
  SVar5.length2_ = pSVar3->length2_;
  local_30.length2_ = SVar5.length2_;
  y = S1ChordAngle::Zero();
  bVar1 = ::operator==(SVar5,y);
  if (bVar1) {
    this_local = (S2Cell *)local_30.length2_;
  }
  else {
    local_160 = (Vector3<double> *)local_b8;
    do {
      Vector3<double>::Vector3(local_160);
      local_160 = local_160 + 1;
    } while (local_160 != (Vector3<double> *)(v[3].c_ + 2));
    for (local_bc = 0; local_bc < 4; local_bc = local_bc + 1) {
      GetVertex((S2Point *)&crosser.acb_,this,local_bc);
      lVar4 = (long)local_bc;
      *(undefined8 *)(local_b8 + lVar4 * 0x18) = crosser._104_8_;
      v[lVar4].c_[0] = local_d0;
      v[lVar4].c_[1] = local_c8;
    }
    S2EdgeCrosser::S2EdgeCrosser
              ((S2EdgeCrosser *)&i_2,a,(S2Point *)min_dist.length2_,(S2Point *)(v[2].c_ + 2));
    for (local_14c = 0; local_14c < 4; local_14c = local_14c + 1) {
      iVar2 = S2EdgeCrosser::CrossingSign
                        ((S2EdgeCrosser *)&i_2,(S2Point *)(local_b8 + (long)local_14c * 0x18));
      if (-1 < iVar2) {
        SVar5 = S1ChordAngle::Zero();
        return (S1ChordAngle)SVar5.length2_;
      }
    }
    for (local_150 = 0; local_150 < 4; local_150 = local_150 + 1) {
      S2::UpdateMinDistance
                ((S2Point *)(local_b8 + (long)local_150 * 0x18),a,(S2Point *)min_dist.length2_,
                 &local_30);
    }
    this_local = (S2Cell *)local_30.length2_;
  }
  return (S1ChordAngle)(double)this_local;
}

Assistant:

S1ChordAngle S2Cell::GetDistance(const S2Point& a, const S2Point& b) const {
  // Possible optimizations:
  //  - Currently the (cell vertex, edge endpoint) distances are computed
  //    twice each, and the length of AB is computed 4 times.
  //  - To fix this, refactor GetDistance(target) so that it skips calculating
  //    the distance to each cell vertex.  Instead, compute the cell vertices
  //    and distances in this function, and add a low-level UpdateMinDistance
  //    that allows the XA, XB, and AB distances to be passed in.
  //  - It might also be more efficient to do all calculations in UVW-space,
  //    since this would involve transforming 2 points rather than 4.

  // First, check the minimum distance to the edge endpoints A and B.
  // (This also detects whether either endpoint is inside the cell.)
  S1ChordAngle min_dist = min(GetDistance(a), GetDistance(b));
  if (min_dist == S1ChordAngle::Zero()) return min_dist;

  // Otherwise, check whether the edge crosses the cell boundary.
  // Note that S2EdgeCrosser needs pointers to vertices.
  S2Point v[4];
  for (int i = 0; i < 4; ++i) {
    v[i] = GetVertex(i);
  }
  S2EdgeCrosser crosser(&a, &b, &v[3]);
  for (int i = 0; i < 4; ++i) {
    if (crosser.CrossingSign(&v[i]) >= 0) {
      return S1ChordAngle::Zero();
    }
  }
  // Finally, check whether the minimum distance occurs between a cell vertex
  // and the interior of the edge AB.  (Some of this work is redundant, since
  // it also checks the distance to the endpoints A and B again.)
  //
  // Note that we don't need to check the distance from the interior of AB to
  // the interior of a cell edge, because the only way that this distance can
  // be minimal is if the two edges cross (already checked above).
  for (int i = 0; i < 4; ++i) {
    S2::UpdateMinDistance(v[i], a, b, &min_dist);
  }
  return min_dist;
}